

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O2

void __thiscall
ModuleAnnotator::annotate
          (ModuleAnnotator *this,
          set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *criteria)

{
  UndefinedFunsBehavior UVar1;
  AnnotationOptsT AVar2;
  unsigned_long __val;
  LLVMDependenceGraph *pLVar3;
  long lVar4;
  raw_ostream *prVar5;
  long *plVar6;
  string ret;
  string module_comment;
  string local_4f8;
  string local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string fl;
  raw_os_ostream outputstream;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&fl,(string *)&this->options->inputFile);
  std::__cxx11::string::string((string *)&ofs,"-debug.ll",(allocator *)&outputstream);
  replace_suffix((string *)&fl,(string *)&ofs);
  std::__cxx11::string::_M_dispose();
  std::ofstream::ofstream((string *)&ofs,(string *)&fl,_S_out);
  _outputstream = std::__cxx11::stringbuf::str;
  std::operator+(&local_4b8,"; -- Generated by llvm-slicer --\n;   * slicing criteria: \'",
                 &this->options->slicingCriteria);
  std::operator+(&local_498,&local_4b8,"\'\n");
  std::operator+(&local_478,&local_498,";   * legacy slicing criteria: \'");
  std::operator+(&local_458,&local_478,&this->options->legacySlicingCriteria);
  std::operator+(&local_438,&local_458,"\'\n");
  std::operator+(&local_418,&local_438,";   * legacy secondary slicing criteria: \'");
  std::operator+(&local_3f8,&local_418,&this->options->legacySecondarySlicingCriteria);
  std::operator+(&local_3d8,&local_3f8,"\'\n");
  std::operator+(&local_3b8,&local_3d8,";   * forward slice: \'");
  std::__cxx11::to_string(&local_4d8,(uint)this->options->forwardSlicing);
  std::operator+(&local_398,&local_3b8,&local_4d8);
  std::operator+(&local_378,&local_398,"\'\n");
  std::operator+(&local_358,&local_378,";   * remove slicing criteria: \'");
  std::__cxx11::to_string(&local_4f8,(uint)this->options->removeSlicingCriteria);
  std::operator+(&local_338,&local_358,&local_4f8);
  std::operator+(&local_318,&local_338,"\'\n");
  std::operator+(&local_2f8,&local_318,";   * undefined functions behavior: \'");
  UVar1 = (this->options->dgOptions).DDAOptions.super_DataDependenceAnalysisOptions.
          undefinedFunsBehavior;
  if (UVar1 == PURE) {
    std::__cxx11::string::string((string *)&ret,"pure",(allocator *)&module_comment);
  }
  else {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    if ((UVar1 & (WRITE_ARGS|WRITE_ANY)) == PURE) {
      if ((UVar1 & (READ_ARGS|READ_ANY)) == PURE) goto LAB_00129410;
      std::__cxx11::string::assign((char *)&ret);
    }
    else {
      std::__cxx11::string::assign((char *)&ret);
      if (((UVar1 & WRITE_ANY) != PURE) || ((UVar1 & WRITE_ARGS) != PURE)) {
        std::__cxx11::string::append((char *)&ret);
      }
      if ((UVar1 & (READ_ARGS|READ_ANY)) == PURE) goto LAB_00129410;
      std::__cxx11::string::append((char *)&ret);
    }
    if (((UVar1 & READ_ANY) != PURE) || ((UVar1 & READ_ARGS) != PURE)) {
      std::__cxx11::string::append((char *)&ret);
    }
  }
LAB_00129410:
  std::operator+(&local_2d8,&local_2f8,&ret);
  std::operator+(&local_2b8,&local_2d8,"\'\n");
  std::operator+(&module_comment,&local_2b8,";   * pointer analysis: ");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if ((this->options->dgOptions).PTAOptions.analysisType < 4) {
    std::__cxx11::string::append((char *)&module_comment);
  }
  std::__cxx11::string::append((char *)&module_comment);
  __val = (this->options->dgOptions).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
          fieldSensitivity.offset;
  if (__val == dg::Offset::UNKNOWN) {
    std::__cxx11::string::append((char *)&module_comment);
  }
  else {
    std::__cxx11::to_string(&local_2d8,__val);
    std::operator+(&local_2b8,&local_2d8,"\n\n");
    std::__cxx11::string::append((string *)&module_comment);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  prVar5 = (raw_ostream *)llvm::errs();
  prVar5 = llvm::raw_ostream::operator<<(prVar5,"[llvm-slicer] Saving IR with annotations to ");
  prVar5 = llvm::raw_ostream::operator<<(prVar5,&fl);
  llvm::raw_ostream::operator<<(prVar5,"\n");
  plVar6 = (long *)operator_new(0x48);
  AVar2 = this->annotationOptions;
  pLVar3 = this->dg;
  *plVar6 = (long)&PTR__LLVMDGAssemblyAnnotationWriter_00146b68;
  *(AnnotationOptsT *)(plVar6 + 1) = AVar2;
  lVar4 = *(long *)(pLVar3 + 0x150);
  plVar6[2] = *(long *)(pLVar3 + 0x148);
  plVar6[3] = lVar4;
  plVar6[4] = (long)criteria;
  plVar6[5] = (long)(plVar6 + 7);
  plVar6[6] = 0;
  *(undefined1 *)(plVar6 + 7) = 0;
  std::__cxx11::string::operator=((string *)(plVar6 + 5),(string *)&module_comment);
  llvm::Module::print(*(raw_ostream **)(this->dg + 0x140),(AssemblyAnnotationWriter *)&outputstream,
                      SUB81(plVar6,0),false);
  (**(code **)(*plVar6 + 8))(plVar6);
  std::__cxx11::string::_M_dispose();
  llvm::raw_os_ostream::~raw_os_ostream(&outputstream);
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void annotate(const std::set<LLVMNode *> *criteria = nullptr) {
        // compose name
        std::string fl(options.inputFile);
        replace_suffix(fl, "-debug.ll");

        // open stream to write to
        std::ofstream ofs(fl);
        llvm::raw_os_ostream outputstream(ofs);

        std::string module_comment =
                "; -- Generated by llvm-slicer --\n"
                ";   * slicing criteria: '" +
                options.slicingCriteria + "'\n" +
                ";   * legacy slicing criteria: '" +
                options.legacySlicingCriteria + "'\n" +
                ";   * legacy secondary slicing criteria: '" +
                options.legacySecondarySlicingCriteria + "'\n" +
                ";   * forward slice: '" +
                std::to_string(options.forwardSlicing) + "'\n" +
                ";   * remove slicing criteria: '" +
                std::to_string(options.removeSlicingCriteria) + "'\n" +
                ";   * undefined functions behavior: '" +
                undefFunsBehaviorToStr(
                        options.dgOptions.DDAOptions.undefinedFunsBehavior) +
                "'\n" + ";   * pointer analysis: ";

        using AnalysisType = LLVMPointerAnalysisOptions::AnalysisType;
        switch (options.dgOptions.PTAOptions.analysisType) {
        case AnalysisType::fi:
            module_comment += "flow-insensitive\n";
            break;
        case AnalysisType::fs:
            module_comment += "flow-sensitive\n";
            break;
        case AnalysisType::inv:
            module_comment += "flow-sensitive with invalidate\n";
            break;
        case AnalysisType::svf:
            module_comment += "SVF\n";
            break;
        }

        module_comment += ";   * PTA field sensitivity: ";
        if (options.dgOptions.PTAOptions.fieldSensitivity == Offset::UNKNOWN)
            module_comment += "full\n\n";
        else
            module_comment +=
                    std::to_string(
                            *options.dgOptions.PTAOptions.fieldSensitivity) +
                    "\n\n";

        llvm::errs() << "[llvm-slicer] Saving IR with annotations to " << fl
                     << "\n";
        auto *annot = new dg::debug::LLVMDGAssemblyAnnotationWriter(
                annotationOptions, dg->getPTA(), dg->getDDA(), criteria);
        annot->emitModuleComment(std::move(module_comment));
        llvm::Module *M = dg->getModule();
        M->print(outputstream, annot);

        delete annot;
    }